

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

void cleanup_part_content(curl_mimepart *part)

{
  if (part->freefunc != (curl_free_callback)0x0) {
    (*part->freefunc)(part->arg);
  }
  part->readfunc = (curl_read_callback)0x0;
  part->seekfunc = (curl_seek_callback)0x0;
  part->freefunc = (curl_free_callback)0x0;
  part->arg = part;
  part->data = (char *)0x0;
  part->fp = (FILE *)0x0;
  part->datasize = 0;
  (part->encstate).bufend = 0;
  (part->encstate).pos = 0;
  (part->encstate).bufbeg = 0;
  part->kind = MIMEKIND_NONE;
  *(byte *)&part->flags = (byte)part->flags & 0xfb;
  part->lastreadstatus = 1;
  (part->state).state = MIMESTATE_BEGIN;
  return;
}

Assistant:

static void cleanup_part_content(curl_mimepart *part)
{
  if(part->freefunc)
    part->freefunc(part->arg);

  part->readfunc = NULL;
  part->seekfunc = NULL;
  part->freefunc = NULL;
  part->arg = (void *) part;          /* Defaults to part itself. */
  part->data = NULL;
  part->fp = NULL;
  part->datasize = (curl_off_t) 0;    /* No size yet. */
  cleanup_encoder_state(&part->encstate);
  part->kind = MIMEKIND_NONE;
  part->flags &= ~MIME_FAST_READ;
  part->lastreadstatus = 1; /* Successful read status. */
  part->state.state = MIMESTATE_BEGIN;
}